

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

int __thiscall glslang::TPpContext::tTokenInput::scan(tTokenInput *this,TPpToken *ppToken)

{
  bool bVar1;
  int iVar2;
  int atom;
  MacroSymbol *local_38;
  MacroSymbol *macro;
  int macroAtom;
  int token;
  TPpToken *ppToken_local;
  tTokenInput *this_local;
  
  iVar2 = TokenStream::getToken(this->tokens,((this->super_tInput).pp)->parseContext,ppToken);
  ppToken->fullyExpanded = (bool)(this->preExpanded & 1);
  bVar1 = TokenStream::atEnd(this->tokens);
  if ((bVar1) && (iVar2 == 0xa2)) {
    atom = TStringAtomMap::getAtom(&((this->super_tInput).pp)->atomStrings,ppToken->name);
    if (atom == 0) {
      local_38 = (MacroSymbol *)0x0;
    }
    else {
      local_38 = lookupMacroDef((this->super_tInput).pp,atom);
    }
    if ((local_38 != (MacroSymbol *)0x0) && ((local_38->field_0x48 & 1) != 0)) {
      ppToken->fullyExpanded = false;
    }
  }
  return iVar2;
}

Assistant:

virtual int scan(TPpToken *ppToken) override {
            int token = tokens->getToken(pp->parseContext, ppToken);
            ppToken->fullyExpanded = preExpanded;
            if (tokens->atEnd() && token == PpAtomIdentifier) {
                int macroAtom = pp->atomStrings.getAtom(ppToken->name);
                MacroSymbol* macro = macroAtom == 0 ? nullptr : pp->lookupMacroDef(macroAtom);
                if (macro && macro->functionLike)
                    ppToken->fullyExpanded = false;
            }
            return token;
        }